

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.hpp
# Opt level: O2

bool __thiscall
mp::NLSolver::ReadSolution<mp::SOLHandler_Easy>(NLSolver *this,SOLHandler_Easy *solh)

{
  bool bVar1;
  pair<NLW2_SOLReadResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  status;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((this->filestub_)._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&this->err_msg_);
    bVar1 = false;
  }
  else {
    std::operator+(&bStack_68,&this->filestub_,".sol");
    ReadSOLFile<mp::SOLHandler_Easy>
              ((pair<NLW2_SOLReadResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_48,&bStack_68,solh,this->p_ut_,(int *)0x0);
    std::__cxx11::string::~string((string *)&bStack_68);
    bVar1 = local_48._0_4_ == NLW2_SOLRead_OK;
    if (!bVar1) {
      std::operator+(&bStack_68,"SOLReader error: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_48 + 8));
      std::__cxx11::string::operator=((string *)&this->err_msg_,(string *)&bStack_68);
      std::__cxx11::string::~string((string *)&bStack_68);
    }
    std::__cxx11::string::~string((string *)(local_48 + 8));
  }
  return bVar1;
}

Assistant:

bool NLSolver::ReadSolution(SOLHandler& solh) {
  if (GetFileStub().empty())
    return (err_msg_="SOLReader: provide filename.", false);
  auto status = mp::ReadSOLFile(
        GetFileStub() + ".sol", solh, Utils());
  if (NLW2_SOLRead_OK != status.first)
    return (err_msg_="SOLReader error: "+status.second, false);
  return true;
}